

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O3

int imcomp_convert_tile_tshort
              (fitsfile *outfptr,void *tiledata,long tilelen,int nullcheck,void *nullflagval,
              int nullval,int zbitpix,double scale,double zero,double actual_bzero,int *intlength,
              int *status)

{
  short sVar1;
  short sVar2;
  int iVar3;
  ulong uVar4;
  
  if ((((zbitpix != 0x10) || (scale != 1.0)) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    ffpmsg("Datatype conversion/scaling is not supported when writing to compressed images");
    *status = 0x19d;
    return 0x19d;
  }
  uVar4 = (ulong)(uint)outfptr->Fptr->compress_type;
  if (uVar4 < 0x34) {
    if ((0x8000000600800U >> (uVar4 & 0x3f) & 1) != 0) {
      *intlength = 2;
      if ((nullcheck == 1) && (sVar1 = *nullflagval, 0 < tilelen && sVar1 != nullval)) {
        uVar4 = tilelen + 1;
        do {
          if (*(short *)((long)tiledata + uVar4 * 2 + -4) == sVar1) {
            *(short *)((long)tiledata + uVar4 * 2 + -4) = (short)nullval;
          }
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      goto LAB_00188c02;
    }
    if (uVar4 != 0x29) goto LAB_00188b79;
    *intlength = 4;
    if (nullcheck == 1) {
      if (0 < tilelen) {
        sVar1 = *nullflagval;
        uVar4 = tilelen + 1;
        do {
          sVar2 = *(short *)((long)tiledata + uVar4 * 2 + -4);
          iVar3 = (int)sVar2;
          if (sVar2 == sVar1) {
            iVar3 = nullval;
          }
          *(int *)((long)tiledata + uVar4 * 4 + -8) = iVar3;
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      goto LAB_00188c02;
    }
LAB_00188bf0:
    iVar3 = 0;
  }
  else {
LAB_00188b79:
    *intlength = 4;
    if ((actual_bzero != 32768.0) || (NAN(actual_bzero))) {
      if (nullcheck == 1) {
        if (0 < tilelen) {
          sVar1 = *nullflagval;
          uVar4 = tilelen + 1;
          do {
            sVar2 = *(short *)((long)tiledata + uVar4 * 2 + -4);
            iVar3 = (int)sVar2;
            if (sVar2 == sVar1) {
              iVar3 = nullval;
            }
            *(int *)((long)tiledata + uVar4 * 4 + -8) = iVar3;
            uVar4 = uVar4 - 1;
          } while (1 < uVar4);
        }
        goto LAB_00188c02;
      }
      goto LAB_00188bf0;
    }
    iVar3 = 0x8000;
    if (nullcheck == 1) {
      if (0 < tilelen) {
        sVar1 = *nullflagval;
        uVar4 = tilelen + 1;
        do {
          sVar2 = *(short *)((long)tiledata + uVar4 * 2 + -4);
          iVar3 = sVar2 + 0x8000;
          if (sVar2 == sVar1) {
            iVar3 = nullval;
          }
          *(int *)((long)tiledata + uVar4 * 4 + -8) = iVar3;
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
      }
      goto LAB_00188c02;
    }
  }
  fits_short_to_int_inplace((short *)tiledata,tilelen,iVar3,status);
LAB_00188c02:
  return *status;
}

Assistant:

int imcomp_convert_tile_tshort(
    fitsfile *outfptr,
    void *tiledata, 
    long tilelen,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    double actual_bzero,
    int *intlength,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input integer*2 tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    short *sbuff;
    int flagval, *idata;
    long ii;
    
       /* We only support writing this integer*2 tile data to a FITS image with 
          BITPIX = 16 and with BZERO = 0 and BSCALE = 1.  */
	  
       if (zbitpix != SHORT_IMG || scale != 1.0 || zero != 0.0) {
           ffpmsg("Datatype conversion/scaling is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

       sbuff = (short *) tiledata;
       idata = (int *) tiledata;
       
       if ( (outfptr->Fptr)->compress_type == RICE_1 || (outfptr->Fptr)->compress_type == GZIP_1
         || (outfptr->Fptr)->compress_type == GZIP_2 || (outfptr->Fptr)->compress_type == BZIP2_1 ) 
       {
           /* don't have to convert to int if using gzip, bzip2 or Rice compression */
           *intlength = 2;
             
           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(short *) (nullflagval);
               if (flagval != nullval) {
                  for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbuff[ii] == (short) flagval)
		       sbuff[ii] = (short) nullval;
                  }
               }
           }
       } else if ((outfptr->Fptr)->compress_type == HCOMPRESS_1) {
           /* have to convert to int if using HCOMPRESS */
           *intlength = 4;

           if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(short *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbuff[ii] == (short) flagval)
		       idata[ii] = nullval;
                    else 
                       idata[ii] = (int) sbuff[ii];
               }
           } else {  /* just do the data type conversion to int */
                 /* have to convert sbuff to an I*4 array, in place */
                 /* sbuff must have been allocated large enough to do this */
                 fits_short_to_int_inplace(sbuff, tilelen, 0, status);
           }
       } else {
           /* have to convert to int if using PLIO */
           *intlength = 4;
           if (zero == 0. && actual_bzero == 32768.) {
             /* Here we are compressing unsigned 16-bit integers that have */
	     /* been offset by -32768 using the standard FITS convention. */
	     /* Since PLIO cannot deal with negative values, we must apply */
	     /* the shift of 32786 to the values to make them all positive. */
	     /* The inverse negative shift will be applied in */
	     /* imcomp_decompress_tile when reading the compressed tile. */
             if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(short *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbuff[ii] == (short) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = (int) sbuff[ii] + 32768;
               }
             } else {  
                 /* have to convert sbuff to an I*4 array, in place */
                 /* sbuff must have been allocated large enough to do this */
                 fits_short_to_int_inplace(sbuff, tilelen, 32768, status);
             }
           } else {
	     /* This is not an unsigned 16-bit integer array, so process normally */
             if (nullcheck == 1) {
               /* reset pixels equal to flagval to the FITS null value, prior to compression */
               flagval = *(short *) (nullflagval);
               for (ii = tilelen - 1; ii >= 0; ii--) {
	            if (sbuff[ii] == (short) flagval)
		       idata[ii] = nullval;
                    else
                       idata[ii] = (int) sbuff[ii];
               }
             } else {  /* just do the data type conversion to int */
                 /* have to convert sbuff to an I*4 array, in place */
                 /* sbuff must have been allocated large enough to do this */
                 fits_short_to_int_inplace(sbuff, tilelen, 0, status);
             }
           }
        }
        return(*status);
}